

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

FT_Int afm_parser_read_vals(AFM_Parser parser,AFM_Value vals,FT_Int n)

{
  size_t __n;
  AFM_Stream stream;
  FT_Int FVar1;
  int iVar2;
  FT_Byte *__s1;
  char *__dest;
  FT_Long FVar3;
  FT_Fixed FVar4;
  ulong uVar5;
  long size;
  ulong uVar6;
  anon_union_8_5_814e15a7_for_u *paVar7;
  bool bVar8;
  FT_Error error;
  FT_Byte *local_38;
  
  stream = parser->stream;
  uVar5 = 0;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar5;
  }
  paVar7 = &vals->u;
  do {
    if (uVar6 == uVar5) {
LAB_001f43e8:
      return (FT_Int)uVar6;
    }
    if (((AFM_ValueRec_ *)(paVar7 + -1))->type == AFM_VALUE_TYPE_STRING) {
      __s1 = (FT_Byte *)afm_stream_read_string(stream);
    }
    else {
      __s1 = (FT_Byte *)afm_stream_read_one(stream);
    }
    if (__s1 == (FT_Byte *)0x0) {
      uVar6 = uVar5 & 0xffffffff;
      goto LAB_001f43e8;
    }
    local_38 = __s1;
    if (((AFM_ValueRec_ *)(paVar7 + -1))->type < (AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_FIXED)) {
      size = (long)stream->cursor - (long)__s1;
      __n = size - 1;
      switch(((AFM_ValueRec_ *)(paVar7 + -1))->type) {
      default:
        __dest = (char *)ft_mem_qalloc(parser->memory,size,&error);
        paVar7->s = __dest;
        if (error == 0) {
          memcpy(__dest,__s1,__n);
          paVar7->s[__n] = '\0';
        }
        break;
      case AFM_VALUE_TYPE_FIXED:
        FVar4 = PS_Conv_ToFixed(&local_38,__s1 + __n,0);
        paVar7->f = FVar4;
        break;
      case AFM_VALUE_TYPE_INTEGER:
        FVar3 = PS_Conv_ToInt(&local_38,__s1 + __n);
        paVar7->i = (FT_Int)FVar3;
        break;
      case AFM_VALUE_TYPE_BOOL:
        if (__n == 4) {
          iVar2 = strncmp((char *)__s1,"true",4);
          bVar8 = iVar2 == 0;
        }
        else {
          bVar8 = false;
        }
        paVar7->b = bVar8;
        break;
      case AFM_VALUE_TYPE_INDEX:
        if (parser->get_index == (_func_FT_Int_char_ptr_FT_Offset_void_ptr *)0x0) {
          paVar7->i = 0;
        }
        else {
          FVar1 = (*parser->get_index)((char *)__s1,__n,parser->user_data);
          paVar7->i = FVar1;
        }
      }
    }
    uVar5 = uVar5 + 1;
    paVar7 = paVar7 + 2;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  afm_parser_read_vals( AFM_Parser  parser,
                        AFM_Value   vals,
                        FT_Int      n )
  {
    AFM_Stream  stream = parser->stream;
    char*       str;
    FT_Int      i;


    if ( n > AFM_MAX_ARGUMENTS )
      return 0;

    for ( i = 0; i < n; i++ )
    {
      FT_Offset  len;
      AFM_Value  val = vals + i;


      if ( val->type == AFM_VALUE_TYPE_STRING )
        str = afm_stream_read_string( stream );
      else
        str = afm_stream_read_one( stream );

      if ( !str )
        break;

      len = AFM_STREAM_KEY_LEN( stream, str );

      switch ( val->type )
      {
      case AFM_VALUE_TYPE_STRING:
      case AFM_VALUE_TYPE_NAME:
        {
          FT_Memory  memory = parser->memory;
          FT_Error   error;


          if ( !FT_QALLOC( val->u.s, len + 1 ) )
          {
            ft_memcpy( val->u.s, str, len );
            val->u.s[len] = '\0';
          }
        }
        break;

      case AFM_VALUE_TYPE_FIXED:
        val->u.f = PS_Conv_ToFixed( (FT_Byte**)(void*)&str,
                                    (FT_Byte*)str + len, 0 );
        break;

      case AFM_VALUE_TYPE_INTEGER:
        val->u.i = PS_Conv_ToInt( (FT_Byte**)(void*)&str,
                                  (FT_Byte*)str + len );
        break;

      case AFM_VALUE_TYPE_BOOL:
        val->u.b = FT_BOOL( len == 4                      &&
                            !ft_strncmp( str, "true", 4 ) );
        break;

      case AFM_VALUE_TYPE_INDEX:
        if ( parser->get_index )
          val->u.i = parser->get_index( str, len, parser->user_data );
        else
          val->u.i = 0;
        break;
      }
    }

    return i;
  }